

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# methods.cpp
# Opt level: O2

rotation_t *
opengv::relative_pose::ge
          (rotation_t *__return_storage_ptr__,RelativeAdapterBase *adapter,
          vector<int,_std::allocator<int>_> *indices,bool useWeights)

{
  geOutput_t output;
  geOutput_t gStack_1c0;
  
  ge(__return_storage_ptr__,adapter,indices,&gStack_1c0,useWeights);
  return __return_storage_ptr__;
}

Assistant:

opengv::rotation_t
opengv::relative_pose::ge(
    const RelativeAdapterBase & adapter,
    const std::vector<int> & indices,
    bool useWeights )
{
  geOutput_t output;
  //output.rotation = adapter.getR12(); //finding starting value using arun
  return ge(adapter,indices,output,useWeights);
}